

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

optional<bool> __thiscall
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_impl_helpers *this,
          olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *inode,byte key_byte,basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *db_instance,read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  long *plVar2;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar3;
  atomic<unsigned_long> *paVar4;
  long lVar5;
  uintptr_t uVar6;
  undefined8 uVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  __int_type_conflict _Var11;
  __int_type_conflict _Var12;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar13;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar14;
  uint uVar15;
  write_guard wVar16;
  bool bVar17;
  ushort uVar18;
  int iVar19;
  ulong uVar20;
  pthread_t pVar21;
  uint uVar22;
  ulong uVar23;
  undefined7 in_register_00000011;
  ulong __n;
  db_type *db_instance_00;
  ushort uVar24;
  optimistic_lock *poVar25;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar26;
  undefined1 auVar27 [16];
  __atomic_base<unsigned_long> local_60;
  write_guard node_guard;
  id local_50;
  write_guard child_guard_1;
  write_guard node_guard_1;
  write_guard child_guard;
  
  db_instance_00 = k.field_0._8_8_;
  uVar23 = k.field_0._0_8_;
  auVar27[0] = SUB81(inode,0);
  auVar27[1] = auVar27[0];
  auVar27[2] = auVar27[0];
  auVar27[3] = auVar27[0];
  auVar27[4] = auVar27[0];
  auVar27[5] = auVar27[0];
  auVar27[6] = auVar27[0];
  auVar27[7] = auVar27[0];
  auVar27[8] = auVar27[0];
  auVar27[9] = auVar27[0];
  auVar27[10] = auVar27[0];
  auVar27[0xb] = auVar27[0];
  auVar27[0xc] = auVar27[0];
  auVar27[0xd] = auVar27[0];
  auVar27[0xe] = auVar27[0];
  auVar27[0xf] = auVar27[0];
  auVar27 = vpcmpeqb_avx(auVar27,*(undefined1 (*) [16])(this + 0x30));
  uVar22 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) &
           ~(-1 << ((byte)this[0x20] & 0x1f));
  uVar15 = 0;
  if (uVar22 != 0) {
    for (; (uVar22 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
    }
  }
  if (uVar22 == 0) {
    plVar8 = (long *)(db_instance->root_pointer_lock).version.version.
                     super___atomic_base<unsigned_long>._M_i;
    lVar9 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
    if (plVar8[1] < 1) goto LAB_001b53ed;
    lVar10 = *plVar8;
    if (lVar9 != lVar10) {
      LOCK();
      plVar2 = plVar8 + 1;
      lVar5 = *plVar2;
      *plVar2 = *plVar2 + -1;
      UNLOCK();
      if (SBORROW8(lVar5,1) != *plVar2 < 0) goto LAB_001b53ce;
      if (lVar9 != lVar10) {
        (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0
        ;
        goto LAB_001b51dc;
      }
    }
    LOCK();
    plVar8 = plVar8 + 1;
    lVar5 = *plVar8;
    *plVar8 = *plVar8 + -1;
    UNLOCK();
    if (SBORROW8(lVar5,1) != *plVar8 < 0) goto LAB_001b53ce;
    (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0;
    if (lVar9 != lVar10) goto LAB_001b51dc;
    poVar25 = parent_critical_section->lock;
    _Var11 = (parent_critical_section->version).version;
    if ((poVar25->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001b53ed;
    _Var12 = (poVar25->version).version.super___atomic_base<unsigned_long>._M_i;
    if (_Var11 == _Var12) {
LAB_001b4faa:
      LOCK();
      paVar1 = &poVar25->read_lock_count;
      lVar9 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar9,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_001b53ce:
        __assert_fail("old_value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
      }
    }
    else {
      LOCK();
      paVar1 = &poVar25->read_lock_count;
      lVar9 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar9,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_001b53ce;
      if (_Var11 == _Var12) goto LAB_001b4faa;
    }
    bVar17 = _Var11 == _Var12;
    parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_001b51b4:
    uVar24 = (ushort)bVar17;
    uVar18 = 0;
  }
  else {
    *(undefined8 *)child_type = *(undefined8 *)(this + (ulong)uVar15 * 8 + 0x40);
    bVar17 = optimistic_lock::check
                       (parent_critical_section->lock,
                        (version_type)(parent_critical_section->version).version);
    if (bVar17) {
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffffa0);
      *child_in_parent =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           local_60._M_i;
      local_60._M_i = 0;
      child_in_parent[1] =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffffa0);
      if (*child_in_parent !=
          (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0
         ) {
        uVar7 = *(undefined8 *)child_type;
        *(byte *)&child_critical_section->lock = (byte)uVar7 & 7;
        if ((uVar7 & (I256|I48)) != LEAF) {
          (node_in_parent->value)._M_i.tagged_ptr = (uintptr_t)(this + (ulong)uVar15 * 8 + 0x40);
          plVar8 = (long *)(db_instance->root_pointer_lock).version.version.
                           super___atomic_base<unsigned_long>._M_i;
          lVar9 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
          if (plVar8[1] < 1) goto LAB_001b53ed;
          lVar10 = *plVar8;
          if (lVar9 == lVar10) {
LAB_001b4f2e:
            LOCK();
            plVar8 = plVar8 + 1;
            lVar5 = *plVar8;
            *plVar8 = *plVar8 + -1;
            UNLOCK();
            if (SBORROW8(lVar5,1) != *plVar8 < 0) goto LAB_001b53ce;
          }
          else {
            LOCK();
            plVar2 = plVar8 + 1;
            lVar5 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar5,1) != *plVar2 < 0) goto LAB_001b53ce;
            if (lVar9 == lVar10) goto LAB_001b4f2e;
          }
          uVar24 = (ushort)(lVar9 == lVar10);
          (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i =
               0;
LAB_001b50f5:
          uVar18 = 1;
          goto LAB_001b51b6;
        }
        uVar20 = (ulong)*(uint *)((uVar7 & 0xfffffffffffffff8) + 0x18);
        __n = uVar23;
        if (uVar20 < uVar23) {
          __n = uVar20;
        }
        iVar19 = bcmp((void *)CONCAT71(in_register_00000011,key_byte),
                      (void *)((uVar7 & 0xfffffffffffffff8) + 0x20),__n);
        if (iVar19 != 0 || uVar20 != uVar23) {
          plVar8 = (long *)(db_instance->root_pointer_lock).version.version.
                           super___atomic_base<unsigned_long>._M_i;
          lVar9 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
          if (plVar8[1] < 1) goto LAB_001b53ed;
          lVar10 = *plVar8;
          if (lVar9 != lVar10) {
            LOCK();
            plVar2 = plVar8 + 1;
            lVar5 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar5,1) != *plVar2 < 0) goto LAB_001b53ce;
            if (lVar9 != lVar10) {
LAB_001b5391:
              (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>.
              _M_i = 0;
              goto LAB_001b51dc;
            }
          }
          LOCK();
          plVar8 = plVar8 + 1;
          lVar5 = *plVar8;
          *plVar8 = *plVar8 + -1;
          UNLOCK();
          if (SBORROW8(lVar5,1) != *plVar8 < 0) goto LAB_001b53ce;
          (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i =
               0;
          if (lVar9 != lVar10) goto LAB_001b51dc;
          poVar25 = parent_critical_section->lock;
          _Var11 = (parent_critical_section->version).version;
          if ((poVar25->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001b53ed;
          _Var12 = (poVar25->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var11 != _Var12) {
            LOCK();
            paVar1 = &poVar25->read_lock_count;
            lVar9 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar9,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_001b53ce;
            if (_Var11 != _Var12) {
              parent_critical_section->lock = (optimistic_lock *)0x0;
              goto LAB_001b51dc;
            }
          }
          LOCK();
          paVar1 = &poVar25->read_lock_count;
          lVar9 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar9,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_001b53ce;
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (_Var11 != _Var12) goto LAB_001b51dc;
          piVar26 = *child_in_parent;
          piVar13 = child_in_parent[1];
          if ((long)piVar26[1].value._M_i.tagged_ptr < 1) {
LAB_001b53ed:
            __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
          }
          piVar14 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)(piVar26->value)._M_i.tagged_ptr;
          if (piVar13 == piVar14) {
LAB_001b5198:
            LOCK();
            piVar26 = piVar26 + 1;
            uVar6 = (piVar26->value)._M_i.tagged_ptr;
            (piVar26->value)._M_i.tagged_ptr = (piVar26->value)._M_i.tagged_ptr - 1;
            UNLOCK();
            if (SBORROW8(uVar6,1) != (long)(piVar26->value)._M_i.tagged_ptr < 0) goto LAB_001b53ce;
          }
          else {
            LOCK();
            piVar3 = piVar26 + 1;
            uVar6 = (piVar3->value)._M_i.tagged_ptr;
            (piVar3->value)._M_i.tagged_ptr = (piVar3->value)._M_i.tagged_ptr - 1;
            UNLOCK();
            if (SBORROW8(uVar6,1) != (long)(piVar3->value)._M_i.tagged_ptr < 0) goto LAB_001b53ce;
            if (piVar13 == piVar14) goto LAB_001b5198;
          }
          bVar17 = piVar13 == piVar14;
          *child_in_parent =
               (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                *)0x0;
          goto LAB_001b51b4;
        }
        if (this[0x20] == (olc_impl_helpers)0x5) {
          basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
          ::
          make_db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&>
                    ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                      *)&stack0xffffffffffffffa0,db_instance_00,
                     (olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)this);
          bVar17 = optimistic_lock::try_upgrade_to_write_lock
                             ((optimistic_lock *)
                              (db_instance->root_pointer_lock).version.version.
                              super___atomic_base<unsigned_long>._M_i,
                              (version_type)
                              (db_instance->root_pointer_lock).read_lock_count.
                              super___atomic_base<long>._M_i);
          node_guard_1.lock = (optimistic_lock *)0x0;
          if (bVar17) {
            node_guard_1.lock =
                 (optimistic_lock *)
                 (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>
                 ._M_i;
          }
          (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i =
               0;
          if (node_guard_1.lock != (optimistic_lock *)0x0) {
            bVar17 = optimistic_lock::try_upgrade_to_write_lock
                               (parent_critical_section->lock,
                                (version_type)(parent_critical_section->version).version);
            child_guard_1.lock = (optimistic_lock *)0x0;
            if (bVar17) {
              child_guard_1.lock = parent_critical_section->lock;
            }
            parent_critical_section->lock = (optimistic_lock *)0x0;
            if (child_guard_1.lock != (optimistic_lock *)0x0) {
              bVar17 = optimistic_lock::try_upgrade_to_write_lock
                                 ((optimistic_lock *)*child_in_parent,
                                  (version_type)child_in_parent[1]);
              piVar26 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                         *)0x0;
              if (bVar17) {
                piVar26 = *child_in_parent;
              }
              *child_in_parent =
                   (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    *)0x0;
              local_50._M_thread = (native_handle_type)piVar26;
              if (piVar26 !=
                  (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                   *)0x0) {
                olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::init((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                        *)node_guard.lock,(EVP_PKEY_CTX *)db_instance_00);
                wVar16 = node_guard;
                node_guard.lock = (optimistic_lock *)0x0;
                if (((ulong)wVar16.lock & 7) != 0) {
                  __assert_fail("(result & ptr_bit_mask) == uintptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                                ,0x182,
                                "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                               );
                }
                node_critical_section->lock = wVar16.lock | 1;
                if (child_guard_1.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!node_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x644,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<std::span<const std::byte>, std::span<const std::byte>>]"
                               );
                }
                if ((in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)local_50._M_thread !=
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)0x0) {
                  __assert_fail("!child_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x645,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<std::span<const std::byte>, std::span<const std::byte>>]"
                               );
                }
                (node_in_parent->value)._M_i.tagged_ptr = 0;
                optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffb0);
                optimistic_lock::write_guard::~write_guard(&child_guard_1);
                optimistic_lock::write_guard::~write_guard(&node_guard_1);
                std::
                unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)&stack0xffffffffffffffa0);
                if (piVar26 !=
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)0x0) {
                  LOCK();
                  paVar4 = (db_instance_00->shrinking_inode_counts)._M_elems + 1;
                  (paVar4->super___atomic_base<unsigned_long>)._M_i =
                       (paVar4->super___atomic_base<unsigned_long>)._M_i + 1;
                  UNLOCK();
                  uVar18 = 1;
                  uVar24 = 1;
                  goto LAB_001b51b6;
                }
                goto LAB_001b51dc;
              }
              optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffb0);
            }
            optimistic_lock::write_guard::~write_guard(&child_guard_1);
          }
          optimistic_lock::write_guard::~write_guard(&node_guard_1);
          std::
          unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)&stack0xffffffffffffffa0);
        }
        else {
          plVar8 = (long *)(db_instance->root_pointer_lock).version.version.
                           super___atomic_base<unsigned_long>._M_i;
          lVar9 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
          if (plVar8[1] < 1) goto LAB_001b53ed;
          lVar10 = *plVar8;
          if (lVar9 != lVar10) {
            LOCK();
            plVar2 = plVar8 + 1;
            lVar5 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar5,1) != *plVar2 < 0) goto LAB_001b53ce;
            if (lVar9 != lVar10) goto LAB_001b5391;
          }
          LOCK();
          plVar8 = plVar8 + 1;
          lVar5 = *plVar8;
          *plVar8 = *plVar8 + -1;
          UNLOCK();
          if (SBORROW8(lVar5,1) != *plVar8 < 0) goto LAB_001b53ce;
          (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i =
               0;
          if (lVar9 == lVar10) {
            bVar17 = optimistic_lock::try_upgrade_to_write_lock
                               (parent_critical_section->lock,
                                (version_type)(parent_critical_section->version).version);
            uVar24 = 0;
            local_60._M_i = 0;
            if (bVar17) {
              local_60._M_i = (__int_type_conflict)parent_critical_section->lock;
            }
            parent_critical_section->lock = (optimistic_lock *)0x0;
            if ((optimistic_lock *)local_60._M_i != (optimistic_lock *)0x0) {
              bVar17 = optimistic_lock::try_upgrade_to_write_lock
                                 ((optimistic_lock *)*child_in_parent,
                                  (version_type)child_in_parent[1]);
              poVar25 = (optimistic_lock *)0x0;
              if (bVar17) {
                poVar25 = (optimistic_lock *)*child_in_parent;
              }
              *child_in_parent =
                   (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    *)0x0;
              node_guard_1.lock = poVar25;
              if (poVar25 != (optimistic_lock *)0x0) {
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete(&poVar25->version);
                pVar21 = pthread_self();
                (poVar25->obsoleter_thread)._M_thread = pVar21;
                node_guard_1.lock = (optimistic_lock *)0x0;
                olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::remove((olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                          *)this,(char *)(ulong)(byte)(-(uVar22 == 0) | (byte)uVar15));
                (node_in_parent->value)._M_i.tagged_ptr = 0;
              }
              uVar24 = (ushort)(poVar25 != (optimistic_lock *)0x0);
              optimistic_lock::write_guard::~write_guard(&node_guard_1);
            }
            optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffa0);
            goto LAB_001b50f5;
          }
        }
      }
    }
    else {
      parent_critical_section->lock = (optimistic_lock *)0x0;
    }
LAB_001b51dc:
    uVar18 = 0;
    uVar24 = 0;
  }
LAB_001b51b6:
  return (_Optional_base<bool,_true,_true>)(uVar18 | uVar24 << 8);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}